

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test::TestBody
          (QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test *this)

{
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  *paVar1;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  *this_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_03;
  bool bVar2;
  TransactionType TVar3;
  TransactionMetaType TVar4;
  char *pcVar5;
  char *in_R9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_9a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_990;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_978;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_8d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_8b8;
  string local_880;
  AssertHelper local_860;
  Message local_858;
  api_filter_type local_850;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__9;
  ComparisonType local_800 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_7f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_7f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_7c8;
  iterator local_7a0;
  size_type local_798;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_790;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  local_775;
  ComparisonType local_774;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  *local_770;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_768;
  iterator local_740;
  size_type local_738;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_730;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_718;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_710;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_6d8;
  iterator local_6a0;
  size_type local_698;
  undefined1 local_690 [8];
  api_filter_type filter2;
  AssertHelper local_640;
  Message local_638;
  string local_630;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_5d8;
  Message local_5d0;
  string local_5c8;
  bool local_5a1;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_570;
  Message local_568;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_528;
  Message local_520;
  bool local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__5;
  Query query_delete_from2;
  AssertHelper local_3d0;
  Message local_3c8;
  api_filter_type local_3c0;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_368;
  iterator local_340;
  size_type local_338;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  *local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_310;
  iterator local_2d8;
  size_type local_2d0;
  undefined1 local_2c8 [8];
  api_filter_type filter1;
  AssertHelper local_278;
  Message local_270;
  string local_268;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_210;
  Message local_208;
  string local_200;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  string local_178;
  AssertHelper local_158;
  Message local_150 [3];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  Query query_delete_from1;
  QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test *this_local;
  
  database::Query::Query
            ((Query *)&gtest_ar_.message_,"delete from company.employee where employee_id = 1");
  TVar3 = database::Query::transactionType((Query *)&gtest_ar_.message_);
  local_131 = TVar3 == delete_from;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_130,
               (AssertionResult *)"query_delete_from1.transactionType() == database::delete_from",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xd7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(local_150);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    TVar4 = database::Query::transactionMetaType((Query *)&gtest_ar_.message_);
    local_191 = TVar4 == dml;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_190,&local_191,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_190,
                 (AssertionResult *)"query_delete_from1.transactionMetaType() == database::dml",
                 "false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xd8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1a0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      database::Query::databaseName_abi_cxx11_(&local_200,(Query *)&gtest_ar_.message_);
      local_1d9 = std::operator==(&local_200,"company");
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_200);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar2) {
        testing::Message::Message(&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_1d8,
                   (AssertionResult *)"query_delete_from1.databaseName() == \"company\"","false",
                   "true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xd9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_210,&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_208);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        database::Query::containerName_abi_cxx11_(&local_268,(Query *)&gtest_ar_.message_);
        local_241 = std::operator==(&local_268,"employee");
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_240,&local_241,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_268);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
        if (!bVar2) {
          testing::Message::Message(&local_270);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&filter1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (internal *)local_240,
                     (AssertionResult *)"query_delete_from1.containerName() == \"employee\"","false"
                     ,"true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_278,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0xda,pcVar5);
          testing::internal::AssertHelper::operator=(&local_278,&local_270);
          testing::internal::AssertHelper::~AssertHelper(&local_278);
          std::__cxx11::string::~string
                    ((string *)&filter1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          testing::Message::~Message(&local_270);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__4.message_.ptr_._2_1_ = 1;
          local_318 = &local_310;
          gtest_ar__4.message_.ptr_._4_4_ = 0;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
          ::pair<const_char_(&)[2],_database::ComparisonType,_true>
                    (&local_368,(char (*) [2])0x17b252,
                     (ComparisonType *)((long)&gtest_ar__4.message_.ptr_ + 4));
          local_340 = &local_368;
          local_338 = 1;
          paVar1 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    *)((long)&gtest_ar__4.message_.ptr_ + 3);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::allocator(paVar1);
          __l_02._M_len = local_338;
          __l_02._M_array = local_340;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector(&local_330,__l_02,paVar1);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>(&local_310,(char (*) [12])"employee_id",&local_330);
          gtest_ar__4.message_.ptr_._2_1_ = 0;
          local_2d8 = &local_310;
          local_2d0 = 1;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                       *)&gtest_ar__4.message_);
          __l_03._M_len = local_2d0;
          __l_03._M_array = local_2d8;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                 *)local_2c8,__l_03,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&gtest_ar__4.message_.ptr_ + 1),(allocator_type *)&gtest_ar__4.message_);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
          ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                        *)&gtest_ar__4.message_);
          local_8b8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                       *)&local_2d8;
          do {
            local_8b8 = local_8b8 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
            ::~pair(local_8b8);
          } while (local_8b8 != &local_310);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector(&local_330);
          std::
          allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
          ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                        *)((long)&gtest_ar__4.message_.ptr_ + 3));
          local_8d0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                       *)&local_340;
          do {
            local_8d0 = local_8d0 + -1;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
            ::~pair(local_8d0);
          } while (local_8d0 != &local_368);
          database::Query::filter_abi_cxx11_(&local_3c0,(Query *)&gtest_ar_.message_);
          local_389 = std::operator==(&local_3c0,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                       *)local_2c8);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_388,&local_389,(type *)0x0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map(&local_3c0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar2) {
            testing::Message::Message(&local_3c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &query_delete_from2.m_filter._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,(internal *)local_388,
                       (AssertionResult *)"query_delete_from1.filter() == filter1","false","true",
                       in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0xde,pcVar5);
            testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
            testing::internal::AssertHelper::~AssertHelper(&local_3d0);
            std::__cxx11::string::~string
                      ((string *)
                       &query_delete_from2.m_filter._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
            testing::Message::~Message(&local_3c8);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            database::Query::Query
                      ((Query *)&gtest_ar__5.message_,
                       "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212"
                      );
            TVar3 = database::Query::transactionType((Query *)&gtest_ar__5.message_);
            local_511 = TVar3 == delete_from;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_510,&local_511,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
            if (!bVar2) {
              testing::Message::Message(&local_520);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_510,
                         (AssertionResult *)
                         "query_delete_from2.transactionType() == database::delete_from","false",
                         "true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_528,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0xe1,pcVar5);
              testing::internal::AssertHelper::operator=(&local_528,&local_520);
              testing::internal::AssertHelper::~AssertHelper(&local_528);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_520);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              TVar4 = database::Query::transactionMetaType((Query *)&gtest_ar__5.message_);
              local_559 = TVar4 == dml;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_558,&local_559,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
              if (!bVar2) {
                testing::Message::Message(&local_568);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_558,
                           (AssertionResult *)
                           "query_delete_from2.transactionMetaType() == database::dml","false",
                           "true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_570,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe2,pcVar5);
                testing::internal::AssertHelper::operator=(&local_570,&local_568);
                testing::internal::AssertHelper::~AssertHelper(&local_570);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_568);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                database::Query::databaseName_abi_cxx11_(&local_5c8,(Query *)&gtest_ar__5.message_);
                local_5a1 = std::operator==(&local_5c8,"company");
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_5a0,&local_5a1,(type *)0x0);
                std::__cxx11::string::~string((string *)&local_5c8);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5a0);
                if (!bVar2) {
                  testing::Message::Message(&local_5d0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_5a0,
                             (AssertionResult *)"query_delete_from2.databaseName() == \"company\"",
                             "false","true",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_5d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                             ,0xe3,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_5d8);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_5d0);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  database::Query::containerName_abi_cxx11_
                            (&local_630,(Query *)&gtest_ar__5.message_);
                  local_609 = std::operator==(&local_630,"employee");
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_608,&local_609,(type *)0x0);
                  std::__cxx11::string::~string((string *)&local_630);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_608);
                  if (!bVar2) {
                    testing::Message::Message(&local_638);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&filter2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (internal *)local_608,
                               (AssertionResult *)
                               "query_delete_from2.containerName() == \"employee\"","false","true",
                               in_R9);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_640,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                               ,0xe4,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_640,&local_638);
                    testing::internal::AssertHelper::~AssertHelper(&local_640);
                    std::__cxx11::string::~string
                              ((string *)&filter2._M_t._M_impl.super__Rb_tree_header._M_node_count);
                    testing::Message::~Message(&local_638);
                  }
                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                    gtest_ar__9.message_.ptr_._6_1_ = 1;
                    local_718 = &local_710;
                    local_770 = &local_768;
                    local_774 = not_equal_to;
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                    ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                              (local_770,(char (*) [9])"fulltime",&local_774);
                    local_740 = &local_768;
                    local_738 = 1;
                    std::
                    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    ::allocator(&local_775);
                    __l_00._M_len = local_738;
                    __l_00._M_array = local_740;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::vector(&local_730,__l_00,&local_775);
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                    ::pair<const_char_(&)[16],_true>
                              (&local_710,(char (*) [16])"employee_status",&local_730);
                    local_7f8 = &local_7f0;
                    local_800[1] = 2;
                    local_718 = &local_6d8;
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                    ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                              (local_7f8,(char (*) [9])"20180223",local_800 + 1);
                    local_7f8 = &local_7c8;
                    local_800[0] = lesser_than;
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                    ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                              (local_7f8,(char (*) [9])0x17c9f7,local_800);
                    local_7a0 = &local_7f0;
                    local_798 = 2;
                    paVar1 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                              *)((long)&gtest_ar__9.message_.ptr_ + 7);
                    std::
                    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    ::allocator(paVar1);
                    __l._M_len = local_798;
                    __l._M_array = local_7a0;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::vector(&local_790,__l,paVar1);
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                    ::pair<const_char_(&)[19],_true>
                              (&local_6d8,(char (*) [19])"employee_join_date",&local_790);
                    gtest_ar__9.message_.ptr_._6_1_ = 0;
                    local_6a0 = &local_710;
                    local_698 = 2;
                    this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                               *)((long)&gtest_ar__9.message_.ptr_ + 4);
                    std::
                    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                    ::allocator(this_00);
                    __l_01._M_len = local_698;
                    __l_01._M_array = local_6a0;
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                           *)local_690,__l_01,
                          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&gtest_ar__9.message_.ptr_ + 5),this_00);
                    std::
                    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                  *)((long)&gtest_ar__9.message_.ptr_ + 4));
                    local_978 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                 *)&local_6a0;
                    do {
                      local_978 = local_978 + -1;
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::~pair(local_978);
                    } while (local_978 != &local_710);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::~vector(&local_790);
                    std::
                    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                                  *)((long)&gtest_ar__9.message_.ptr_ + 7));
                    local_990 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                 *)&local_7a0;
                    do {
                      local_990 = local_990 + -1;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::~pair(local_990);
                    } while (local_990 != &local_7f0);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::~vector(&local_730);
                    std::
                    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
                    ::~allocator(&local_775);
                    local_9a8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                 *)&local_740;
                    do {
                      local_9a8 = local_9a8 + -1;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::~pair(local_9a8);
                    } while (local_9a8 != &local_768);
                    database::Query::filter_abi_cxx11_(&local_850,(Query *)&gtest_ar__5.message_);
                    local_819 = std::operator==(&local_850,
                                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                                 *)local_690);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_818,&local_819,(type *)0x0);
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::~map(&local_850);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_818);
                    if (!bVar2) {
                      testing::Message::Message(&local_858);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_880,(internal *)local_818,
                                 (AssertionResult *)"query_delete_from2.filter() == filter2","false"
                                 ,"true",in_R9);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_860,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xe9,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_860,&local_858);
                      testing::internal::AssertHelper::~AssertHelper(&local_860);
                      std::__cxx11::string::~string((string *)&local_880);
                      testing::Message::~Message(&local_858);
                    }
                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                      gtest_ar__1.message_.ptr_._4_4_ = 0;
                    }
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                            *)local_690);
                  }
                }
              }
            }
            database::Query::~Query((Query *)&gtest_ar__5.message_);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                  *)local_2c8);
        }
      }
    }
  }
  database::Query::~Query((Query *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(QueryTests_DeleteFrom,canDetermineSpecificationForDeleteFrom)
{
  database::Query query_delete_from1 = "delete from company.employee where employee_id = 1";
  ASSERT_TRUE(query_delete_from1.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from1.databaseName() == "company");
  ASSERT_TRUE(query_delete_from1.containerName() == "employee");
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_delete_from1.filter() == filter1);

  database::Query query_delete_from2 = "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212";
  ASSERT_TRUE(query_delete_from2.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from2.databaseName() == "company");
  ASSERT_TRUE(query_delete_from2.containerName() == "employee");
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::not_equal_to}}},
    {"employee_join_date",{{"20180223",database::greater_or_equal_to},{"20190212",database::lesser_than}}}
  };
  ASSERT_TRUE(query_delete_from2.filter() == filter2);
}